

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptorProto::EnumDescriptorProto
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  bool bVar1;
  string *psVar2;
  Arena *default_value;
  void *pvVar3;
  EnumDescriptorProto *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff18;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff20;
  EnumOptions *in_stack_ffffffffffffff58;
  EnumOptions *in_stack_ffffffffffffff60;
  EnumOptions *this_00;
  EnumDescriptorProto *this_01;
  
  Message::Message((Message *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  *in_RDI = &PTR__EnumDescriptorProto_009636f0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
            );
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x515d54);
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
             in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
             in_stack_ffffffffffffff18);
  this_01 = (EnumDescriptorProto *)(in_RDI + 6);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
             in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
             in_stack_ffffffffffffff18);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  this_00 = (EnumOptions *)&in_RSI->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)this_00)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(((InternalMetadataWithArena *)this_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff60 = this_00;
    }
    else {
      in_stack_ffffffffffffff58 =
           (EnumOptions *)internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff60 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               (UnknownFieldSet *)in_stack_ffffffffffffff08);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0xc),psVar2);
  bVar1 = _internal_has_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    psVar2 = _internal_name_abi_cxx11_((EnumDescriptorProto *)0x515f4e);
    default_value =
         GetArenaNoVirtual((EnumDescriptorProto *)
                           CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)psVar2,(string *)default_value,
               (string *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
  }
  bVar1 = _internal_has_options(this_01);
  if (bVar1) {
    pvVar3 = operator_new(0x50);
    EnumOptions::EnumOptions(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_RDI[0xd] = pvVar3;
  }
  else {
    in_RDI[0xd] = 0;
  }
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto(const EnumDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      value_(from.value_),
      reserved_range_(from.reserved_range_),
      reserved_name_(from.reserved_name_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::EnumOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumDescriptorProto)
}